

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# start_stop_test.cpp
# Opt level: O0

int main(void)

{
  thread_pool local_d8 [8];
  thread_pool pool;
  
  nonstd::thread_pool::thread_pool(local_d8,0xe);
  nonstd::thread_pool::start();
  nonstd::thread_pool::stop();
  nonstd::thread_pool::~thread_pool(local_d8);
  return 0;
}

Assistant:

int main()
{
   nonstd::thread_pool pool(14);
   pool.start();

   pool.stop();

   return 0;
}